

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void __thiscall
duckdb::SortedAggregateBindData::SortedAggregateBindData
          (SortedAggregateBindData *this,SortedAggregateBindData *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  pointer pBVar3;
  FunctionNullHandling FVar4;
  FunctionErrors FVar5;
  FunctionCollationHandling FVar6;
  AggregateDistinctDependent AVar7;
  undefined8 uVar8;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> uVar9;
  pointer pFVar10;
  long lVar11;
  aggregate_size_t *pp_Var12;
  aggregate_size_t *pp_Var13;
  pointer this_00;
  byte bVar14;
  BoundOrderByNode local_70;
  vector<duckdb::ListSegmentFunctions,_true> *local_58;
  vector<duckdb::LogicalType,_true> *local_50;
  vector<duckdb::ListSegmentFunctions,_true> *local_48;
  vector<duckdb::LogicalType,_true> *local_40;
  AggregateFunction *local_38;
  
  bVar14 = 0;
  (this->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__SortedAggregateBindData_019b2320;
  this->context = other->context;
  SimpleFunction::SimpleFunction
            ((SimpleFunction *)&this->function,(SimpleFunction *)&other->function);
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_019937c0;
  LogicalType::LogicalType
            (&(this->function).super_BaseScalarFunction.return_type,
             &(other->function).super_BaseScalarFunction.return_type);
  FVar4 = (other->function).super_BaseScalarFunction.null_handling;
  FVar5 = (other->function).super_BaseScalarFunction.errors;
  FVar6 = (other->function).super_BaseScalarFunction.collation_handling;
  (this->function).super_BaseScalarFunction.stability =
       (other->function).super_BaseScalarFunction.stability;
  (this->function).super_BaseScalarFunction.null_handling = FVar4;
  (this->function).super_BaseScalarFunction.errors = FVar5;
  (this->function).super_BaseScalarFunction.collation_handling = FVar6;
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_01996688;
  pp_Var12 = &(other->function).state_size;
  pp_Var13 = &(this->function).state_size;
  for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
    *pp_Var13 = *pp_Var12;
    pp_Var12 = pp_Var12 + (ulong)bVar14 * -2 + 1;
    pp_Var13 = pp_Var13 + (ulong)bVar14 * -2 + 1;
  }
  AVar7 = (other->function).distinct_dependent;
  (this->function).order_dependent = (other->function).order_dependent;
  (this->function).distinct_dependent = AVar7;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->function).function_info.internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (other->function).function_info.internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_38 = &this->function;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&(this->arg_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(other->arg_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  (this->bind_info).
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  local_48 = &this->arg_funcs;
  local_40 = &this->arg_types;
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::vector
            (&local_48->
              super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
             ,&(other->arg_funcs).
               super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
            );
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orders).super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &this->sort_types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(other->sort_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_58 = &this->sort_funcs;
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::vector
            (&local_58->
              super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
             ,&(other->sort_funcs).
               super_vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>
            );
  this->sorted_on_args = other->sorted_on_args;
  this->threshold = other->threshold;
  this->external = other->external;
  if ((other->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl != (FunctionData *)0x0) {
    pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator->(&other->bind_info);
    (*pFVar10->_vptr_FunctionData[2])
              ((_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                *)&local_70,pFVar10);
    uVar8 = local_70._0_8_;
    local_70._0_8_ = (FunctionData *)0x0;
    _Var2._M_head_impl =
         (this->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (this->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)uVar8;
    if (_Var2._M_head_impl != (FunctionData *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_FunctionData[1])();
    }
    if ((FunctionData *)local_70._0_8_ != (FunctionData *)0x0) {
      (*(*(_func_int ***)local_70._0_8_)[1])();
    }
  }
  this_00 = (other->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (other->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pBVar3) {
    do {
      BoundOrderByNode::Copy(&local_70,this_00);
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
      emplace_back<duckdb::BoundOrderByNode>
                (&(this->orders).
                  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
                 &local_70);
      uVar9.super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           local_70.stats;
      if (local_70.stats.
          super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
           )0x0) {
        BaseStatistics::~BaseStatistics
                  ((BaseStatistics *)
                   local_70.stats.
                   super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
        operator_delete((void *)uVar9.
                                super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                                .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl
                       );
      }
      local_70.stats.
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
            )0x0;
      if (local_70.expression.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)local_70.expression.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
      this_00 = this_00 + 1;
    } while (this_00 != pBVar3);
  }
  return;
}

Assistant:

SortedAggregateBindData(const SortedAggregateBindData &other)
	    : context(other.context), function(other.function), arg_types(other.arg_types), arg_funcs(other.arg_funcs),
	      sort_types(other.sort_types), sort_funcs(other.sort_funcs), sorted_on_args(other.sorted_on_args),
	      threshold(other.threshold), external(other.external) {
		if (other.bind_info) {
			bind_info = other.bind_info->Copy();
		}
		for (auto &order : other.orders) {
			orders.emplace_back(order.Copy());
		}
	}